

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmenet.c
# Opt level: O0

void enet_service_network_lock(CManager cm,void *void_trans)

{
  long lVar1;
  long in_RSI;
  undefined8 in_RDI;
  CMtrans_services_conflict svc;
  enet_client_data_ptr ecd;
  transport_entry_conflict trans;
  void *in_stack_00000078;
  CManager in_stack_00000080;
  
  lVar1 = *(long *)(*(long *)(in_RSI + 0x98) + 0x18);
  (**(code **)(lVar1 + 0xb0))
            (in_RDI,
             "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmenet.c"
             ,0x1fd);
  enet_service_network(in_stack_00000080,in_stack_00000078);
  (**(code **)(lVar1 + 0xa8))
            (in_RDI,
             "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmenet.c"
             ,0x1ff);
  return;
}

Assistant:

static
void
enet_service_network_lock(CManager cm, void *void_trans)
{
    transport_entry trans = (transport_entry) void_trans;
    enet_client_data_ptr ecd = (enet_client_data_ptr) trans->trans_data;
    CMtrans_services svc = ecd->svc;
    ACQUIRE_CM_LOCK(svc, cm);
    enet_service_network(cm, void_trans);
    DROP_CM_LOCK(svc, cm);
}